

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTShapeProfileDef::~IfcTShapeProfileDef(IfcTShapeProfileDef *this)

{
  ~IfcTShapeProfileDef((IfcTShapeProfileDef *)&this[-1].FilletRadius.have);
  return;
}

Assistant:

IfcTShapeProfileDef() : Object("IfcTShapeProfileDef") {}